

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  __m128i alVar5;
  __m128i alVar6;
  __m128i alVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  __m128i local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar18 [16];
  undefined1 auVar14 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar23 [16];
  undefined1 auVar29 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar41 [16];
  undefined1 auVar50 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar59 [16];
  undefined1 auVar67 [16];
  undefined1 auVar73 [16];
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar88 [16];
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar81 [16];
  undefined1 auVar89 [16];
  undefined1 auVar96 [16];
  undefined1 auVar102 [16];
  undefined1 auVar82 [16];
  undefined1 auVar90 [16];
  undefined1 auVar97 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar116 [16];
  undefined1 auVar108 [16];
  undefined1 auVar117 [16];
  undefined1 auVar109 [16];
  undefined1 auVar118 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  
  alVar1 = input[0xf];
  alVar2 = input[0xd];
  alVar3 = input[0xb];
  alVar4 = input[9];
  alVar5 = input[3];
  alVar6 = input[5];
  alVar7 = input[7];
  auVar144._0_12_ = alVar1._0_12_;
  auVar144._12_2_ = alVar1[0]._6_2_;
  auVar144._14_2_ = *(undefined2 *)((long)*input + 6);
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._0_10_ = alVar1._0_10_;
  auVar143._10_2_ = *(undefined2 *)((long)*input + 4);
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_8_ = alVar1[0];
  auVar142._8_2_ = alVar1[0]._4_2_;
  auVar141._8_8_ = auVar142._8_8_;
  auVar141._6_2_ = *(undefined2 *)((long)*input + 2);
  auVar141._4_2_ = alVar1[0]._2_2_;
  auVar141._0_2_ = (undefined2)alVar1[0];
  auVar141._2_2_ = (short)(*input)[0];
  auVar131._0_12_ = alVar2._0_12_;
  auVar131._12_2_ = alVar2[0]._6_2_;
  auVar131._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = alVar2._0_10_;
  auVar130._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = alVar2[0];
  auVar129._8_2_ = alVar2[0]._4_2_;
  auVar128._8_8_ = auVar129._8_8_;
  auVar128._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar128._4_2_ = alVar2[0]._2_2_;
  auVar128._0_2_ = (undefined2)alVar2[0];
  auVar128._2_2_ = (short)input[2][0];
  auVar109._0_12_ = alVar3._0_12_;
  auVar109._12_2_ = alVar3[0]._6_2_;
  auVar109._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._0_10_ = alVar3._0_10_;
  auVar108._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._0_8_ = alVar3[0];
  auVar107._8_2_ = alVar3[0]._4_2_;
  auVar106._8_8_ = auVar107._8_8_;
  auVar106._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar106._4_2_ = alVar3[0]._2_2_;
  auVar106._0_2_ = (undefined2)alVar3[0];
  auVar106._2_2_ = (short)input[4][0];
  auVar82._0_12_ = alVar4._0_12_;
  auVar82._12_2_ = alVar4[0]._6_2_;
  auVar82._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._0_10_ = alVar4._0_10_;
  auVar81._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._0_8_ = alVar4[0];
  auVar80._8_2_ = alVar4[0]._4_2_;
  auVar79._8_8_ = auVar80._8_8_;
  auVar79._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar79._4_2_ = alVar4[0]._2_2_;
  auVar79._0_2_ = (undefined2)alVar4[0];
  auVar79._2_2_ = (short)input[6][0];
  auVar60._0_12_ = alVar7._0_12_;
  auVar60._12_2_ = alVar7[0]._6_2_;
  auVar60._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = alVar7._0_10_;
  auVar59._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = alVar7[0];
  auVar58._8_2_ = alVar7[0]._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar57._4_2_ = alVar7[0]._2_2_;
  auVar57._0_2_ = (undefined2)alVar7[0];
  auVar57._2_2_ = (short)input[8][0];
  auVar41._0_12_ = alVar6._0_12_;
  auVar41._12_2_ = alVar6[0]._6_2_;
  auVar41._14_2_ = *(undefined2 *)((long)input[10] + 6);
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = alVar6._0_10_;
  auVar40._10_2_ = *(undefined2 *)((long)input[10] + 4);
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_8_ = alVar6[0];
  auVar39._8_2_ = alVar6[0]._4_2_;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._6_2_ = *(undefined2 *)((long)input[10] + 2);
  auVar38._4_2_ = alVar6[0]._2_2_;
  auVar38._0_2_ = (undefined2)alVar6[0];
  auVar38._2_2_ = (short)input[10][0];
  auVar24._0_12_ = alVar5._0_12_;
  auVar24._12_2_ = alVar5[0]._6_2_;
  auVar24._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar23._12_4_ = auVar24._12_4_;
  auVar23._0_10_ = alVar5._0_10_;
  auVar23._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar22._10_6_ = auVar23._10_6_;
  auVar22._0_8_ = alVar5[0];
  auVar22._8_2_ = alVar5[0]._4_2_;
  auVar21._8_8_ = auVar22._8_8_;
  auVar21._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar21._4_2_ = alVar5[0]._2_2_;
  auVar21._0_2_ = (undefined2)alVar5[0];
  auVar21._2_2_ = (short)input[0xc][0];
  auVar138._8_4_ = 0xc90ffb;
  auVar138._0_8_ = 0xc90ffb00c90ffb;
  auVar138._12_4_ = 0xc90ffb;
  auVar139 = pmaddwd(auVar138,auVar141);
  auVar145._8_4_ = 0xf00500c9;
  auVar145._0_8_ = 0xf00500c9f00500c9;
  auVar145._12_4_ = 0xf00500c9;
  auVar146 = pmaddwd(auVar145,auVar141);
  auVar140._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_138 = (__m128i)packssdw(auVar140,auVar140);
  auVar147._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar147._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar147._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar147._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_128 = packssdw(auVar147,auVar147);
  auVar148._8_4_ = 0x3e30f85;
  auVar148._0_8_ = 0x3e30f8503e30f85;
  auVar148._12_4_ = 0x3e30f85;
  auVar139 = pmaddwd(auVar148,auVar128);
  auVar150._8_4_ = 0xf07b03e3;
  auVar150._0_8_ = 0xf07b03e3f07b03e3;
  auVar150._12_4_ = 0xf07b03e3;
  auVar146 = pmaddwd(auVar150,auVar128);
  auVar149._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar149._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar149._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar149._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_118 = packssdw(auVar149,auVar149);
  auVar151._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar151._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar151._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar151._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_108 = packssdw(auVar151,auVar151);
  auVar134._8_4_ = 0x6d70e77;
  auVar134._0_8_ = 0x6d70e7706d70e77;
  auVar134._12_4_ = 0x6d70e77;
  auVar139 = pmaddwd(auVar134,auVar106);
  auVar136._8_4_ = 0xf18906d7;
  auVar136._0_8_ = 0xf18906d7f18906d7;
  auVar136._12_4_ = 0xf18906d7;
  auVar146 = pmaddwd(auVar136,auVar106);
  auVar135._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_f8 = packssdw(auVar135,auVar135);
  auVar137._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar137._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar137._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar137._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_e8 = packssdw(auVar137,auVar137);
  auVar121._8_4_ = 0x9880cda;
  auVar121._0_8_ = 0x9880cda09880cda;
  auVar121._12_4_ = 0x9880cda;
  auVar139 = pmaddwd(auVar121,auVar79);
  auVar132._8_4_ = 0xf3260988;
  auVar132._0_8_ = 0xf3260988f3260988;
  auVar132._12_4_ = 0xf3260988;
  auVar146 = pmaddwd(auVar132,auVar79);
  auVar122._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar122._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar122._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar122._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar122,auVar122);
  auVar133._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_c8 = packssdw(auVar133,auVar133);
  auVar83._8_4_ = 0xbdb0abf;
  auVar83._0_8_ = 0xbdb0abf0bdb0abf;
  auVar83._12_4_ = 0xbdb0abf;
  auVar139 = pmaddwd(auVar83,auVar57);
  auVar123._8_4_ = 0xf5410bdb;
  auVar123._0_8_ = 0xf5410bdbf5410bdb;
  auVar123._12_4_ = 0xf5410bdb;
  auVar146 = pmaddwd(auVar123,auVar57);
  auVar84._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_b8 = packssdw(auVar84,auVar84);
  auVar124._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar124._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar124._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar124._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_a8 = packssdw(auVar124,auVar124);
  auVar61._8_4_ = 0xdb9083a;
  auVar61._0_8_ = 0xdb9083a0db9083a;
  auVar61._12_4_ = 0xdb9083a;
  auVar139 = pmaddwd(auVar61,auVar38);
  auVar85._8_4_ = 0xf7c60db9;
  auVar85._0_8_ = 0xf7c60db9f7c60db9;
  auVar85._12_4_ = 0xf7c60db9;
  auVar146 = pmaddwd(auVar85,auVar38);
  auVar62._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  auVar86._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar62,auVar62);
  local_88 = packssdw(auVar86,auVar86);
  auVar42._8_4_ = 0xf110564;
  auVar42._0_8_ = 0xf1105640f110564;
  auVar42._12_4_ = 0xf110564;
  auVar139 = pmaddwd(auVar42,auVar21);
  auVar63._8_4_ = 0xfa9c0f11;
  auVar63._0_8_ = 0xfa9c0f11fa9c0f11;
  auVar63._12_4_ = 0xfa9c0f11;
  auVar146 = pmaddwd(auVar63,auVar21);
  auVar43._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  auVar64._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar43,auVar43);
  local_68 = packssdw(auVar64,auVar64);
  auVar25._8_4_ = 0xfd40259;
  auVar25._0_8_ = 0xfd402590fd40259;
  auVar25._12_4_ = 0xfd40259;
  auVar139._2_2_ = (short)input[0xe][0];
  auVar139._0_2_ = (short)input[1][0];
  auVar139._4_2_ = *(undefined2 *)((long)input[1] + 2);
  auVar139._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar139._8_2_ = *(undefined2 *)((long)input[1] + 4);
  auVar139._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar139._12_2_ = *(undefined2 *)((long)input[1] + 6);
  auVar139._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar146 = pmaddwd(auVar25,auVar139);
  auVar44._8_4_ = 0xfda70fd4;
  auVar44._0_8_ = 0xfda70fd4fda70fd4;
  auVar44._12_4_ = 0xfda70fd4;
  auVar139 = pmaddwd(auVar44,auVar139);
  auVar26._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar26,auVar26);
  local_48 = packssdw(auVar45,auVar45);
  iadst16_stage3_ssse3(&local_138);
  auVar68._0_12_ = local_b8._0_12_;
  auVar68._12_2_ = local_b8._6_2_;
  auVar68._14_2_ = local_a8._6_2_;
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._0_10_ = local_b8._0_10_;
  auVar67._10_2_ = local_a8._4_2_;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._0_8_ = local_b8._0_8_;
  auVar66._8_2_ = local_b8._4_2_;
  auVar65._8_8_ = auVar66._8_8_;
  auVar65._6_2_ = local_a8._2_2_;
  auVar65._4_2_ = local_b8._2_2_;
  auVar65._0_2_ = local_b8._0_2_;
  auVar65._2_2_ = local_a8._0_2_;
  auVar46._8_4_ = 0x31f0fb1;
  auVar46._0_8_ = 0x31f0fb1031f0fb1;
  auVar46._12_4_ = 0x31f0fb1;
  auVar110._8_4_ = 0xf04f031f;
  auVar110._0_8_ = 0xf04f031ff04f031f;
  auVar110._12_4_ = 0xf04f031f;
  auVar146 = pmaddwd(auVar110,auVar65);
  auVar139 = pmaddwd(auVar65,auVar46);
  auVar69._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  auVar111._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar111._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar111._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar111._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_b8 = packssdw(auVar69,auVar69);
  local_a8 = packssdw(auVar111,auVar111);
  auVar90._0_12_ = local_98._0_12_;
  auVar90._12_2_ = local_98._6_2_;
  auVar90._14_2_ = local_88._6_2_;
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = local_98._0_10_;
  auVar89._10_2_ = local_88._4_2_;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._0_8_ = local_98._0_8_;
  auVar88._8_2_ = local_98._4_2_;
  auVar87._8_8_ = auVar88._8_8_;
  auVar87._6_2_ = local_88._2_2_;
  auVar87._4_2_ = local_98._2_2_;
  auVar87._0_2_ = local_98._0_2_;
  auVar87._2_2_ = local_88._0_2_;
  auVar70._8_4_ = 0xd4e08e4;
  auVar70._0_8_ = 0xd4e08e40d4e08e4;
  auVar70._12_4_ = 0xd4e08e4;
  auVar112._8_4_ = 0xf71c0d4e;
  auVar112._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar112._12_4_ = 0xf71c0d4e;
  auVar146 = pmaddwd(auVar112,auVar87);
  auVar139 = pmaddwd(auVar87,auVar70);
  auVar91._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  auVar113._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar91,auVar91);
  local_88 = packssdw(auVar113,auVar113);
  auVar30._0_12_ = local_78._0_12_;
  auVar30._12_2_ = local_78._6_2_;
  auVar30._14_2_ = local_68._6_2_;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = local_78._0_10_;
  auVar29._10_2_ = local_68._4_2_;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = local_78._0_8_;
  auVar28._8_2_ = local_78._4_2_;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._6_2_ = local_68._2_2_;
  auVar27._4_2_ = local_78._2_2_;
  auVar27._0_2_ = local_78._0_2_;
  auVar27._2_2_ = local_68._0_2_;
  auVar92._8_4_ = 0xfb1fce1;
  auVar92._0_8_ = 0xfb1fce10fb1fce1;
  auVar92._12_4_ = 0xfb1fce1;
  auVar146 = pmaddwd(auVar92,auVar27);
  auVar139 = pmaddwd(auVar27,auVar46);
  auVar93._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar31._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar31._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar31._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar31._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar93,auVar93);
  local_68 = packssdw(auVar31,auVar31);
  auVar33._0_12_ = local_58._0_12_;
  auVar33._12_2_ = local_58._6_2_;
  auVar33._14_2_ = local_48._6_2_;
  auVar9._12_4_ = auVar33._12_4_;
  auVar9._0_10_ = local_58._0_10_;
  auVar9._10_2_ = local_48._4_2_;
  auVar8._10_6_ = auVar9._10_6_;
  auVar8._0_8_ = local_58._0_8_;
  auVar8._8_2_ = local_58._4_2_;
  auVar146._8_8_ = auVar8._8_8_;
  auVar146._6_2_ = local_48._2_2_;
  auVar146._4_2_ = local_58._2_2_;
  auVar146._0_2_ = local_58._0_2_;
  auVar146._2_2_ = local_48._0_2_;
  auVar32._8_4_ = 0x8e4f2b2;
  auVar32._0_8_ = 0x8e4f2b208e4f2b2;
  auVar32._12_4_ = 0x8e4f2b2;
  auVar33 = pmaddwd(auVar32,auVar146);
  auVar139 = pmaddwd(auVar146,auVar70);
  auVar34._0_4_ = auVar33._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar33._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar33._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar33._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar34,auVar34);
  local_48 = packssdw(auVar10,auVar10);
  iadst16_stage5_ssse3(&local_138);
  auVar74._0_12_ = local_f8._0_12_;
  auVar74._12_2_ = local_f8._6_2_;
  auVar74._14_2_ = local_e8._6_2_;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = local_f8._0_10_;
  auVar73._10_2_ = local_e8._4_2_;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._0_8_ = local_f8._0_8_;
  auVar72._8_2_ = local_f8._4_2_;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = local_e8._2_2_;
  auVar71._4_2_ = local_f8._2_2_;
  auVar71._0_2_ = local_f8._0_2_;
  auVar71._2_2_ = local_e8._0_2_;
  auVar35._8_4_ = 0x61f0ec8;
  auVar35._0_8_ = 0x61f0ec8061f0ec8;
  auVar35._12_4_ = 0x61f0ec8;
  auVar146 = pmaddwd(auVar71,auVar35);
  auVar114._8_4_ = 0xf138061f;
  auVar114._0_8_ = 0xf138061ff138061f;
  auVar114._12_4_ = 0xf138061f;
  auVar139 = pmaddwd(auVar71,auVar114);
  auVar125._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar125._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar125._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar125._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar75._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar75._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar75._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar75._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_f8 = packssdw(auVar125,auVar125);
  local_e8 = packssdw(auVar75,auVar75);
  auVar97._0_12_ = local_d8._0_12_;
  auVar97._12_2_ = local_d8._6_2_;
  auVar97._14_2_ = local_c8._6_2_;
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._0_10_ = local_d8._0_10_;
  auVar96._10_2_ = local_c8._4_2_;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._0_8_ = local_d8._0_8_;
  auVar95._8_2_ = local_d8._4_2_;
  auVar94._8_8_ = auVar95._8_8_;
  auVar94._6_2_ = local_c8._2_2_;
  auVar94._4_2_ = local_d8._2_2_;
  auVar94._0_2_ = local_d8._0_2_;
  auVar94._2_2_ = local_c8._0_2_;
  auVar76._8_4_ = 0xec8f9e1;
  auVar76._0_8_ = 0xec8f9e10ec8f9e1;
  auVar76._12_4_ = 0xec8f9e1;
  auVar146 = pmaddwd(auVar94,auVar76);
  auVar139 = pmaddwd(auVar94,auVar35);
  auVar126._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar126._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar126._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar126._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar98._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar98._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar98._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar98._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar126,auVar126);
  local_c8 = packssdw(auVar98,auVar98);
  auVar50._0_12_ = local_78._0_12_;
  auVar50._12_2_ = local_78._6_2_;
  auVar50._14_2_ = local_68._6_2_;
  auVar49._12_4_ = auVar50._12_4_;
  auVar49._0_10_ = local_78._0_10_;
  auVar49._10_2_ = local_68._4_2_;
  auVar48._10_6_ = auVar49._10_6_;
  auVar48._0_8_ = local_78._0_8_;
  auVar48._8_2_ = local_78._4_2_;
  auVar47._8_8_ = auVar48._8_8_;
  auVar47._6_2_ = local_68._2_2_;
  auVar47._4_2_ = local_78._2_2_;
  auVar47._0_2_ = local_78._0_2_;
  auVar47._2_2_ = local_68._0_2_;
  auVar146 = pmaddwd(auVar47,auVar35);
  auVar139 = pmaddwd(auVar47,auVar114);
  auVar99._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar51._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar99,auVar99);
  local_68 = packssdw(auVar51,auVar51);
  auVar14._0_12_ = local_58._0_12_;
  auVar14._12_2_ = local_58._6_2_;
  auVar14._14_2_ = local_48._6_2_;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = local_58._0_10_;
  auVar13._10_2_ = local_48._4_2_;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = local_58._0_8_;
  auVar12._8_2_ = local_58._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = local_48._2_2_;
  auVar11._4_2_ = local_58._2_2_;
  auVar11._0_2_ = local_58._0_2_;
  auVar11._2_2_ = local_48._0_2_;
  auVar146 = pmaddwd(auVar76,auVar11);
  auVar139 = pmaddwd(auVar11,auVar35);
  auVar77._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar77,auVar77);
  local_48 = packssdw(auVar15,auVar15);
  iadst16_stage7_ssse3(&local_138);
  auVar118._0_12_ = local_118._0_12_;
  auVar118._12_2_ = local_118._6_2_;
  auVar118._14_2_ = local_108._6_2_;
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._0_10_ = local_118._0_10_;
  auVar117._10_2_ = local_108._4_2_;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._0_8_ = local_118._0_8_;
  auVar116._8_2_ = local_118._4_2_;
  auVar115._8_8_ = auVar116._8_8_;
  auVar115._6_2_ = local_108._2_2_;
  auVar115._4_2_ = local_118._2_2_;
  auVar115._0_2_ = local_118._0_2_;
  auVar115._2_2_ = local_108._0_2_;
  auVar36._8_4_ = 0xb500b50;
  auVar36._0_8_ = 0xb500b500b500b50;
  auVar36._12_4_ = 0xb500b50;
  auVar146 = pmaddwd(auVar115,auVar36);
  auVar78._8_4_ = 0xf4b00b50;
  auVar78._0_8_ = 0xf4b00b50f4b00b50;
  auVar78._12_4_ = 0xf4b00b50;
  auVar139 = pmaddwd(auVar115,auVar78);
  auVar127._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar127._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar127._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar127._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar119._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar119._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar119._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar119._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_118 = packssdw(auVar127,auVar127);
  local_108 = packssdw(auVar119,auVar119);
  auVar103._0_12_ = local_d8._0_12_;
  auVar103._12_2_ = local_d8._6_2_;
  auVar103._14_2_ = local_c8._6_2_;
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_10_ = local_d8._0_10_;
  auVar102._10_2_ = local_c8._4_2_;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._0_8_ = local_d8._0_8_;
  auVar101._8_2_ = local_d8._4_2_;
  auVar100._8_8_ = auVar101._8_8_;
  auVar100._6_2_ = local_c8._2_2_;
  auVar100._4_2_ = local_d8._2_2_;
  auVar100._0_2_ = local_d8._0_2_;
  auVar100._2_2_ = local_c8._0_2_;
  auVar146 = pmaddwd(auVar100,auVar36);
  auVar139 = pmaddwd(auVar100,auVar78);
  auVar120._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar120._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar120._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar120._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar104._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar104._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar104._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar104._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar120,auVar120);
  local_c8 = packssdw(auVar104,auVar104);
  auVar55._0_12_ = local_98._0_12_;
  auVar55._12_2_ = local_98._6_2_;
  auVar55._14_2_ = local_88._6_2_;
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._0_10_ = local_98._0_10_;
  auVar54._10_2_ = local_88._4_2_;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._0_8_ = local_98._0_8_;
  auVar53._8_2_ = local_98._4_2_;
  auVar52._8_8_ = auVar53._8_8_;
  auVar52._6_2_ = local_88._2_2_;
  auVar52._4_2_ = local_98._2_2_;
  auVar52._0_2_ = local_98._0_2_;
  auVar52._2_2_ = local_88._0_2_;
  auVar146 = pmaddwd(auVar52,auVar36);
  auVar139 = pmaddwd(auVar52,auVar78);
  auVar105._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar56._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar105,auVar105);
  local_88 = packssdw(auVar56,auVar56);
  auVar19._0_12_ = local_58._0_12_;
  auVar19._12_2_ = local_58._6_2_;
  auVar19._14_2_ = local_48._6_2_;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = local_58._0_10_;
  auVar18._10_2_ = local_48._4_2_;
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = local_58._0_8_;
  auVar17._8_2_ = local_58._4_2_;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = local_48._2_2_;
  auVar16._4_2_ = local_58._2_2_;
  auVar16._0_2_ = local_58._0_2_;
  auVar16._2_2_ = local_48._0_2_;
  auVar146 = pmaddwd(auVar36,auVar16);
  auVar139 = pmaddwd(auVar16,auVar78);
  auVar37._0_4_ = auVar146._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar146._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar146._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar146._12_4_ + 0x800 >> 0xc;
  auVar20._0_4_ = auVar139._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar139._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar139._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar139._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar37,auVar37);
  local_48 = packssdw(auVar20,auVar20);
  iadst16_stage9_ssse3(output,&local_138);
  return;
}

Assistant:

static void iadst16_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  const __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[16];
  x[0] = input[15];
  x[1] = input[0];
  x[2] = input[13];
  x[3] = input[2];
  x[4] = input[11];
  x[5] = input[4];
  x[6] = input[9];
  x[7] = input[6];
  x[8] = input[7];
  x[9] = input[8];
  x[10] = input[5];
  x[11] = input[10];
  x[12] = input[3];
  x[13] = input[12];
  x[14] = input[1];
  x[15] = input[14];

  // stage 2
  btf_16_4p_sse2(cospi_p02_p62, cospi_p62_m02, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p10_p54, cospi_p54_m10, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p18_p46, cospi_p46_m18, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_p26_p38, cospi_p38_m26, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p34_p30, cospi_p30_m34, x[8], x[9], x[8], x[9]);
  btf_16_4p_sse2(cospi_p42_p22, cospi_p22_m42, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_p50_p14, cospi_p14_m50, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_p58_p06, cospi_p06_m58, x[14], x[15], x[14], x[15]);

  // stage 3
  iadst16_stage3_ssse3(x);

  // stage 4
  btf_16_4p_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);
  btf_16_4p_sse2(cospi_p40_p24, cospi_p24_m40, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_m56_p08, cospi_p08_p56, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_m24_p40, cospi_p40_p24, x[14], x[15], x[14], x[15]);

  // stage 5
  iadst16_stage5_ssse3(x);

  // stage 6
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[14], x[15], x[14], x[15]);

  // stage 7
  iadst16_stage7_ssse3(x);

  // stage 8
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[14], x[15], x[14], x[15]);

  // stage 9
  iadst16_stage9_ssse3(output, x);
}